

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O2

uint8_t * __thiscall
Lodtalk::MethodAssembler::PushReceiverVariable::encode(PushReceiverVariable *this,uint8_t *buffer)

{
  int iVar1;
  uint8_t *puVar2;
  long lVar3;
  
  iVar1 = this->index;
  if ((0xf < iVar1 | this->longInstruction) == 1) {
    InstructionNode::encodeExtA(&this->super_InstructionNode,buffer,(long)(iVar1 / 0x100));
    *buffer = 0xe2;
    iVar1 = this->index;
    lVar3 = 2;
    puVar2 = buffer + 1;
  }
  else {
    lVar3 = 1;
    puVar2 = buffer;
  }
  *puVar2 = (uint8_t)iVar1;
  return buffer + lVar3;
}

Assistant:

virtual uint8_t *encode(uint8_t *buffer)
	{
		if(!longInstruction && index < BytecodeSet::PushReceiverVariableShortRangeSize)
		{
			*buffer++ = uint8_t(BytecodeSet::PushReceiverVariableShortFirst + index);
			return buffer;
		}

        buffer = encodeExtA(buffer, index / 256);

		*buffer++ = BytecodeSet::PushReceiverVariable;
		*buffer++ = index % 256;
		return buffer;
	}